

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber_tlv_length.c
# Opt level: O1

ssize_t ber_skip_length(asn_codec_ctx_t *opt_codec_ctx,int _is_constructed,void *ptr,size_t size)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  ulong unaff_R12;
  byte *ptr_00;
  ber_tlv_len_t vlen;
  ber_tlv_tag_t tag;
  asn_codec_ctx_t *local_48;
  asn_codec_ctx_t *local_40;
  ber_tlv_tag_t local_34;
  
  if ((opt_codec_ctx != (asn_codec_ctx_t *)0x0) &&
     (sVar7 = opt_codec_ctx->max_stack_size, sVar7 != 0)) {
    lVar6 = (long)opt_codec_ctx - (long)&local_48;
    lVar5 = -lVar6;
    if (lVar6 < 1) {
      lVar5 = lVar6;
    }
    if (SBORROW8(lVar5,-sVar7) != (long)(lVar5 + sVar7) < 0) {
      return -1;
    }
  }
  local_48 = opt_codec_ctx;
  uVar2 = ber_fetch_length(_is_constructed,ptr,size,(ber_tlv_len_t *)&local_48);
  uVar3 = uVar2;
  if (0 < (long)uVar2) {
    if ((long)local_48 < 0) {
      ptr_00 = (byte *)((long)ptr + uVar2);
      sVar7 = size - uVar2;
      local_40 = opt_codec_ctx;
      do {
        uVar3 = ber_fetch_tag(ptr_00,sVar7,&local_34);
        if ((long)uVar3 < 1) {
          bVar1 = false;
        }
        else {
          uVar4 = ber_skip_length(local_40,*ptr_00 >> 5 & 1,ptr_00 + uVar3,sVar7 - uVar3);
          if ((long)uVar4 < 1) {
            bVar1 = false;
            uVar3 = uVar4;
          }
          else {
            uVar2 = uVar2 + uVar3 + uVar4;
            if ((*ptr_00 == 0) && (ptr_00[1] == 0)) {
              bVar1 = false;
              uVar3 = uVar2;
            }
            else {
              ptr_00 = ptr_00 + uVar3 + uVar4;
              sVar7 = sVar7 - (uVar3 + uVar4);
              bVar1 = true;
              uVar3 = unaff_R12;
            }
          }
        }
        unaff_R12 = uVar3;
      } while (bVar1);
    }
    else {
      uVar2 = (long)&local_48->max_stack_size + uVar2;
      uVar3 = 0;
      if (uVar2 <= size) {
        uVar3 = uVar2;
      }
    }
  }
  return uVar3;
}

Assistant:

ssize_t
ber_skip_length(asn_codec_ctx_t *opt_codec_ctx,
		int _is_constructed, const void *ptr, size_t size) {
	ber_tlv_len_t vlen;	/* Length of V in TLV */
	ssize_t tl;		/* Length of L in TLV */
	ssize_t ll;		/* Length of L in TLV */
	size_t skip;

	/*
	 * Make sure we didn't exceed the maximum stack size.
	 */
	if(ASN__STACK_OVERFLOW_CHECK(opt_codec_ctx))
		return -1;

	/*
	 * Determine the size of L in TLV.
	 */
	ll = ber_fetch_length(_is_constructed, ptr, size, &vlen);
	if(ll <= 0) return ll;

	/*
	 * Definite length.
	 */
	if(vlen >= 0) {
		skip = ll + vlen;
		if(skip > size)
			return 0;	/* Want more */
		return skip;
	}

	/*
	 * Indefinite length!
	 */
	ASN_DEBUG("Skipping indefinite length");
	for(skip = ll, ptr = ((const char *)ptr) + ll, size -= ll;;) {
		ber_tlv_tag_t tag;

		/* Fetch the tag */
		tl = ber_fetch_tag(ptr, size, &tag);
		if(tl <= 0) return tl;

		ll = ber_skip_length(opt_codec_ctx,
			BER_TLV_CONSTRUCTED(ptr),
			((const char *)ptr) + tl, size - tl);
		if(ll <= 0) return ll;

		skip += tl + ll;

		/*
		 * This may be the end of the indefinite length structure,
		 * two consecutive 0 octets.
		 * Check if it is true.
		 */
		if(((const uint8_t *)ptr)[0] == 0
		&& ((const uint8_t *)ptr)[1] == 0)
			return skip;

		ptr = ((const char *)ptr) + tl + ll;
		size -= tl + ll;
 	}

	/* UNREACHABLE */
}